

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O3

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>::
rt_binary_expr<0ul,viennamath::op_mult<double>,1ul>
          (rt_binary_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
          *param_1)

{
  undefined8 *puVar1;
  
  *(undefined ***)this = &PTR__rt_binary_expr_0011e158;
  *(undefined8 *)(this + 8) = 0;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = &PTR__op_interface_0011e538;
  *(undefined8 **)(this + 0x10) = puVar1;
  *(undefined8 *)(this + 0x18) = 0;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = &PTR__rt_expression_interface_0011e3f8;
  puVar1[1] = 0;
  *(undefined8 **)(this + 8) = puVar1;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = &PTR__rt_expression_interface_0011e3f8;
  puVar1[1] = 1;
  *(undefined8 **)(this + 0x18) = puVar1;
  return;
}

Assistant:

explicit rt_binary_expr(ct_binary_expr<ct_variable<id1>, OP, ct_variable<id2> > const & /*other*/) : op_(new op_binary<OP, InterfaceType>())
      {
        //std::cout << "Constructing from expression " << other << " to " << OP::apply(value1, value2) << std::endl;
        lhs_ = std::auto_ptr<InterfaceType>(new rt_variable<InterfaceType>(id1));
        rhs_ = std::auto_ptr<InterfaceType>(new rt_variable<InterfaceType>(id2));
      }